

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O1

void __thiscall QTreeWidgetPrivate::emitItemCollapsed(QTreeWidgetPrivate *this,QModelIndex *index)

{
  QObject *pQVar1;
  QAbstractItemModel *pQVar2;
  long in_FS_OFFSET;
  QAbstractItemModel *local_30;
  void *local_28;
  QAbstractItemModel **ppQStack_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = *(QObject **)
            &(this->super_QTreeViewPrivate).super_QAbstractItemViewPrivate.
             super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate.field_0x8;
  QMetaObject::cast((QObject *)&QTreeModel::staticMetaObject);
  pQVar2 = (index->m).ptr;
  if (pQVar2 != (QAbstractItemModel *)0x0) {
    pQVar2 = (QAbstractItemModel *)index->i;
  }
  local_30 = (QAbstractItemModel *)0x0;
  if (-1 < (index->c | index->r)) {
    local_30 = pQVar2;
  }
  ppQStack_20 = &local_30;
  local_28 = (void *)0x0;
  QMetaObject::activate(pQVar1,&QTreeWidget::staticMetaObject,7,&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTreeWidgetPrivate::emitItemCollapsed(const QModelIndex &index)
{
    Q_Q(QTreeWidget);
    emit q->itemCollapsed(item(index));
}